

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

void matd_print(matd_t *m,char *fmt)

{
  int iVar1;
  uint local_20;
  uint local_1c;
  int j;
  int i;
  char *fmt_local;
  matd_t *m_local;
  
  if (m == (matd_t *)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xbb,"void matd_print(const matd_t *, const char *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xbc,"void matd_print(const matd_t *, const char *)");
  }
  iVar1 = matd_is_scalar(m);
  if (iVar1 == 0) {
    for (local_1c = 0; local_1c < m->nrows; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < m->ncols; local_20 = local_20 + 1) {
        printf(fmt,m[(ulong)(local_1c * m->ncols + local_20) + 1]);
      }
      printf("\n");
    }
  }
  else {
    printf(fmt,m[1]);
    printf("\n");
  }
  return;
}

Assistant:

void matd_print(const matd_t *m, const char *fmt)
{
    assert(m != NULL);
    assert(fmt != NULL);

    if (matd_is_scalar(m)) {
        printf(fmt, MATD_EL(m, 0, 0));
        printf("\n");
    } else {
        for (int i = 0; i < m->nrows; i++) {
            for (int j = 0; j < m->ncols; j++) {
                printf(fmt, MATD_EL(m, i, j));
            }
            printf("\n");
        }
    }
}